

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_exclude_pattern_from_file(archive *_a,char *pathname,wchar_t nullSeparator)

{
  int iVar1;
  wchar_t magic_test;
  archive_match *a;
  wchar_t nullSeparator_local;
  char *pathname_local;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xcad11c9,1,"archive_match_exclude_pattern_from_file");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else {
    _a_local._4_4_ =
         add_pattern_from_file
                   ((archive_match *)_a,(match_list *)&_a[1].vtable,L'\x01',pathname,nullSeparator);
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_match_exclude_pattern_from_file(struct archive *_a,
    const char *pathname, int nullSeparator)
{
	struct archive_match *a;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_exclude_pattern_from_file");
	a = (struct archive_match *)_a;

	return add_pattern_from_file(a, &(a->exclusions), 1, pathname,
		nullSeparator);
}